

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::
     call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
               (QPromise<void> *promise,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  undefined1 local_48 [8];
  Data *local_40;
  undefined **local_38;
  PromiseData<void> *local_30;
  QPromiseBase<void> local_28;
  
  bVar2 = QtPromise::QPromiseBase<void>::isFulfilled(&promise->super_QPromiseBase<void>);
  if (bVar2) {
    PromiseResolver<void>::resolve(&resolve->m_resolver);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<void>::isRejected(&promise->super_QPromiseBase<void>);
  if (bVar2) {
    PromiseResolver<void>::reject<QtPromisePrivate::PromiseError_const&>
              (&reject->m_resolver,
               &(((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>).
                m_error);
    return;
  }
  local_48 = (undefined1  [8])(resolve->m_resolver).m_d.d;
  if (local_48 != (undefined1  [8])0x0) {
    LOCK();
    (((Data *)local_48)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_48)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<void>).m_d.d;
  if (local_30 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_0014b1f0;
  QtPromise::QPromiseBase<void>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_2_>
            (&local_28,(anon_class_8_1_c4c2b4cc *)promise,(anon_class_24_2_d74e9aa7 *)local_48);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_28);
  call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)local_48
            );
  return;
}

Assistant:

static void call(const TPromise& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve();
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve();
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }